

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O2

LoopHandle __thiscall
gmlc::networking::AsioContextManager::startContextLoop(AsioContextManager *this)

{
  __shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2> *this_00;
  thread tVar1;
  bool bVar2;
  long in_RSI;
  thread contextThread;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_a0 [2];
  unique_lock<std::mutex> nullLock;
  packaged_task<void_()> contextTask;
  loop_mode exp;
  shared_ptr<gmlc::networking::AsioContextManager> ptr;
  packaged_task<void_()> local_58;
  __shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  LOCK();
  *(int *)(in_RSI + 0x18) = *(int *)(in_RSI + 0x18) + 1;
  UNLOCK();
  std::__shared_ptr<gmlc::networking::AsioContextManager,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<gmlc::networking::AsioContextManager,void>
            ((__shared_ptr<gmlc::networking::AsioContextManager,(__gnu_cxx::_Lock_policy)2> *)&ptr,
             (__weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2> *)
             (in_RSI + 8));
  exp = stopped;
  bVar2 = std::atomic<gmlc::networking::AsioContextManager::loop_mode>::compare_exchange_strong
                    ((atomic<gmlc::networking::AsioContextManager::loop_mode> *)(in_RSI + 0x54),&exp
                     ,starting,seq_cst);
  if (bVar2) {
    std::__shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2> *)
                 &nullLock,
                 &ptr.
                  super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                );
    std::
    __create_task_state<void(),gmlc::networking::AsioContextManager::startContextLoop()::__0,std::allocator<int>>
              ((anon_class_16_1_ba1d6e4e_for__M_fn *)&contextTask,(allocator<int> *)&nullLock);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&nullLock._M_owns);
    std::unique_lock<std::mutex>::unique_lock(&nullLock,(mutex_type *)(in_RSI + 0x58));
    std::make_unique<asio::io_context::work,asio::io_context&>((io_context *)&contextThread);
    tVar1 = contextThread;
    contextThread._M_id._M_thread = (id)0;
    std::__uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::
    reset((__uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_> *)
          (in_RSI + 0x48),(pointer)tVar1._M_id._M_thread);
    std::unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::
    ~unique_ptr((unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_> *)
                &contextThread);
    std::packaged_task<void_()>::get_future(&local_58);
    contextThread._M_id._M_thread =
         (id)(id)local_58._M_state.
                 super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
    a_Stack_a0[0]._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_58._M_state.
         super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_58._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_58._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::shared_future<void>::operator=
              ((shared_future<void> *)(in_RSI + 0x88),(shared_future<void> *)&contextThread);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_a0);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_58._M_state.
                super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               (__shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2> *)
               (in_RSI + 0x88));
    storeFuture((shared_future<void> *)&local_30);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    std::unique_lock<std::mutex>::unlock(&nullLock);
    std::thread::thread<std::packaged_task<void()>,,void>(&contextThread,&contextTask);
    std::thread::detach();
    std::thread::~thread(&contextThread);
    std::unique_lock<std::mutex>::~unique_lock(&nullLock);
    std::packaged_task<void_()>::~packaged_task(&contextTask);
  }
  else {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&contextTask,(mutex_type *)(in_RSI + 0x58));
    bVar2 = asio::io_context::stopped(*(io_context **)(in_RSI + 0x40));
    if (bVar2) {
      this_00 = (__shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2> *)
                (in_RSI + 0x88);
      if (*(long *)(in_RSI + 0x88) != 0) {
        std::__basic_future<void>::_M_get_result((__basic_future<void> *)this_00);
      }
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&contextTask);
      exp = stopped;
      bVar2 = std::atomic<gmlc::networking::AsioContextManager::loop_mode>::compare_exchange_strong
                        ((atomic<gmlc::networking::AsioContextManager::loop_mode> *)(in_RSI + 0x54),
                         &exp,starting,seq_cst);
      if (bVar2) {
        std::__shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr((__shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                      *)&contextThread,
                     &ptr.
                      super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                    );
        std::
        __create_task_state<void(),gmlc::networking::AsioContextManager::startContextLoop()::__1,std::allocator<int>>
                  ((anon_class_16_1_ba1d6e4e_for__M_fn *)&nullLock,(allocator<int> *)&contextThread)
        ;
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_a0);
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&contextTask);
        std::make_unique<asio::io_context::work,asio::io_context&>((io_context *)&contextThread);
        tVar1 = contextThread;
        contextThread._M_id._M_thread = (id)0;
        std::__uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::
        reset((__uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
               *)(in_RSI + 0x48),(pointer)tVar1._M_id._M_thread);
        std::unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::
        ~unique_ptr((unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
                     *)&contextThread);
        std::packaged_task<void_()>::get_future(&local_58);
        contextThread._M_id._M_thread =
             (id)(id)local_58._M_state.
                     super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
        a_Stack_a0[0]._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_58._M_state.
             super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        local_58._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_58._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::shared_future<void>::operator=
                  ((shared_future<void> *)this_00,(shared_future<void> *)&contextThread);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_a0);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_58._M_state.
                    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_40,this_00);
        storeFuture((shared_future<void> *)&local_40);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount)
        ;
        std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&contextTask);
        std::thread::thread<std::packaged_task<void()>,,void>
                  (&contextThread,(packaged_task<void_()> *)&nullLock);
        std::thread::detach();
        std::thread::~thread(&contextThread);
        std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)&nullLock);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&contextTask);
  }
  std::
  make_unique<gmlc::networking::AsioContextManager::Servicer,std::shared_ptr<gmlc::networking::AsioContextManager>>
            ((shared_ptr<gmlc::networking::AsioContextManager> *)this);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &ptr.
              super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (__uniq_ptr_data<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>,_true,_true>
          )(__uniq_ptr_data<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>,_true,_true>
            )this;
}

Assistant:

AsioContextManager::LoopHandle AsioContextManager::startContextLoop()
{
    ++runCounter;  // atomic
    auto ptr = shared_from_this();
    loop_mode exp = loop_mode::stopped;
    if (running.compare_exchange_strong(exp, loop_mode::starting)) {
        std::packaged_task<void()> contextTask(
            [ptr]() { contextProcessingLoop(ptr); });
        //   std::cout << "run Context loop " << runCounter << "\n";
        std::unique_lock<std::mutex> nullLock(runningLoopLock);

        nullwork = std::make_unique<asio::io_context::work>(getBaseContext());
        loopRet = contextTask.get_future().share();
        AsioContextManager::storeFuture(loopRet);
        nullLock.unlock();
        std::thread contextThread(std::move(contextTask));
        contextThread.detach();
        //  std::cout << "starting context loop thread " << runCounter << "\n";
    } else {
        std::unique_lock<std::mutex> nullLock(runningLoopLock);
        if (getBaseContext().stopped()) {
            // std::cout << "run Context loop already stopped" << runCounter <<
            // "\n";
            if (loopRet.valid()) {
                loopRet.get();
            }
            nullLock.unlock();
            exp = loop_mode::stopped;
            if (running.compare_exchange_strong(exp, loop_mode::starting)) {
                std::packaged_task<void()> contextTask(
                    [ptr]() { contextProcessingLoop(ptr); });
                nullLock.lock();
                nullwork =
                    std::make_unique<asio::io_context::work>(getBaseContext());
                loopRet = contextTask.get_future();
                AsioContextManager::storeFuture(loopRet);
                nullLock.unlock();
                std::thread contextThread(std::move(contextTask));
                contextThread.detach();
            }
        }
    }
    return std::make_unique<Servicer>(std::move(ptr));
}